

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::SourceLocationTable::Find
          (SourceLocationTable *this,Message *descriptor,ErrorLocation location,int *line,
          int *column)

{
  second_type *psVar1;
  int iVar2;
  first_type local_20;
  
  local_20.first = descriptor;
  local_20.second = location;
  psVar1 = FindOrNull<std::map<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,std::pair<int,int>,std::less<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>,std::allocator<std::pair<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>const,std::pair<int,int>>>>>
                     (&this->location_map_,&local_20);
  if (psVar1 == (second_type *)0x0) {
    *line = -1;
    iVar2 = 0;
  }
  else {
    *line = psVar1->first;
    iVar2 = psVar1->second;
  }
  *column = iVar2;
  return psVar1 != (second_type *)0x0;
}

Assistant:

bool SourceLocationTable::Find(
    const Message* descriptor,
    DescriptorPool::ErrorCollector::ErrorLocation location,
    int* line, int* column) const {
  const std::pair<int, int>* result =
      FindOrNull(location_map_, std::make_pair(descriptor, location));
  if (result == NULL) {
    *line   = -1;
    *column = 0;
    return false;
  } else {
    *line   = result->first;
    *column = result->second;
    return true;
  }
}